

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void undo_flood(int x,int y,void *roomcnt)

{
  level *plVar1;
  uint uVar2;
  
  plVar1 = level;
  uVar2 = (uint)(byte)level->locations[x][y].typ;
  if ((uVar2 < 0x1d) && ((0x100e0000U >> (uVar2 & 0x1f) & 1) != 0)) {
    *(int *)roomcnt = *roomcnt + 1;
    plVar1->locations[x][y].typ = '\x19';
    newsym(x,y);
    return;
  }
  return;
}

Assistant:

static void undo_flood(int x, int y, void *roomcnt)
{
	struct rm *loc = &level->locations[x][y];

	if (loc->typ != POOL &&
	    loc->typ != MOAT &&
	    loc->typ != WATER &&
	    loc->typ != FOUNTAIN)
	    return;

	(*(int *)roomcnt)++;

	/* Get rid of a pool at x, y */
	loc->typ = ROOM;
	newsym(x, y);
}